

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::TestCaseFilter::isMatch(TestCaseFilter *this,TestCaseInfo *testCase)

{
  string *s;
  logic_error *this_00;
  string *name;
  TestCaseInfo *testCase_local;
  TestCaseFilter *this_local;
  
  s = TestCaseInfo::getName_abi_cxx11_(testCase);
  switch(this->m_wildcardPosition) {
  case NoWildcard:
    this_local._7_1_ = std::operator==(&this->m_stringToMatch,s);
    break;
  case WildcardAtStart:
    this_local._7_1_ = endsWith(s,&this->m_stringToMatch);
    break;
  case WildcardAtEnd:
    this_local._7_1_ = startsWith(s,&this->m_stringToMatch);
    break;
  case WildcardAtBothEnds:
    this_local._7_1_ = contains(s,&this->m_stringToMatch);
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Unhandled wildcard type");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return this_local._7_1_;
}

Assistant:

bool isMatch( const TestCaseInfo& testCase ) const {
            const std::string& name = testCase.getName();

            switch( m_wildcardPosition ) {
                case NoWildcard:
                    return m_stringToMatch == name;
                case WildcardAtStart:
                    return endsWith( name, m_stringToMatch );
                case WildcardAtEnd:
                    return startsWith( name, m_stringToMatch );
                case WildcardAtBothEnds:
                    return contains( name, m_stringToMatch );
            }
            throw std::logic_error( "Unhandled wildcard type" );
        }